

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

void __thiscall MIDISong2::AdvanceTracks(MIDISong2 *this,DWORD time)

{
  int *piVar1;
  int iVar2;
  TrackInfo *pTVar3;
  long lVar4;
  
  iVar2 = this->NumTracks;
  if (0 < (long)iVar2) {
    pTVar3 = this->Tracks;
    lVar4 = 0;
    do {
      if ((&pTVar3->Finished)[lVar4] == false) {
        piVar1 = (int *)((long)&pTVar3->Delay + lVar4);
        *piVar1 = *piVar1 - time;
        piVar1 = (int *)((long)&pTVar3->PlayedTime + lVar4);
        *piVar1 = *piVar1 + time;
      }
      lVar4 = lVar4 + 0x40;
    } while ((long)iVar2 * 0x40 != lVar4);
  }
  return;
}

Assistant:

void MIDISong2::AdvanceTracks(DWORD time)
{
	for (int i = 0; i < NumTracks; ++i)
	{
		if (!Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
}